

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_v_predictor_8x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  ushort uVar8;
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  uint uVar15;
  short sVar16;
  short sVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  short sVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar23 [16];
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar38 [16];
  
  auVar18 = _DAT_00514ca0;
  auVar17 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  sVar16 = auVar17._0_2_;
  sVar19 = auVar17._2_2_;
  auVar17._2_2_ = sVar19 * 0x1f;
  auVar17._0_2_ = sVar16;
  auVar17._4_2_ = sVar16 * 0x3c;
  auVar17._6_2_ = sVar19 * 0x56;
  auVar17._8_2_ = sVar16 * 0x6f;
  auVar17._10_2_ = sVar19 * 0x85;
  auVar17._12_2_ = sVar16 * 0x9a;
  auVar17._14_2_ = sVar19 * 0xac;
  uVar1 = *(ulong *)top_row;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar9._7_8_ = 0;
  auVar9._0_7_ = auVar7._8_7_;
  Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar13._9_6_ = 0;
  auVar13._0_9_ = Var10;
  auVar11._1_10_ = SUB1510(auVar13 << 0x30,5);
  auVar11[0] = (char)(uVar1 >> 0x10);
  auVar14._11_4_ = 0;
  auVar14._0_11_ = auVar11;
  auVar12._1_12_ = SUB1512(auVar14 << 0x20,3);
  auVar12[0] = (char)(uVar1 >> 8);
  uVar15 = 0xfefdfefe;
  do {
    uVar15 = uVar15 + 0x2020202;
    auVar38._4_4_ = uVar15;
    auVar38._0_4_ = uVar15;
    auVar38._8_4_ = uVar15;
    auVar38._12_4_ = uVar15;
    auVar23 = pshufb(auVar18,auVar38);
    auVar38 = pshufb(auVar17,auVar38);
    sVar20 = (short)Var10;
    uVar8 = auVar2._13_2_ >> 8;
    uVar21 = auVar23._0_2_ * (ushort)(byte)uVar1 + auVar38._0_2_ + 0x80;
    uVar24 = auVar23._2_2_ * auVar12._0_2_ + auVar38._2_2_ + 0x80;
    uVar26 = auVar23._4_2_ * auVar11._0_2_ + auVar38._4_2_ + 0x80;
    uVar28 = auVar23._6_2_ * sVar20 + auVar38._6_2_ + 0x80;
    uVar30 = auVar23._8_2_ * auVar7._8_2_ + auVar38._8_2_ + 0x80;
    uVar32 = auVar23._10_2_ * auVar5._10_2_ + auVar38._10_2_ + 0x80;
    uVar34 = auVar23._12_2_ * auVar3._12_2_ + auVar38._12_2_ + 0x80;
    uVar36 = auVar23._14_2_ * uVar8 + auVar38._14_2_ + 0x80;
    uVar22 = uVar21 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar29 != 0) * (uVar29 < 0x100) *
                                                      (char)(uVar28 >> 8) - (0xff < uVar29),
                                                      CONCAT12((uVar27 != 0) * (uVar27 < 0x100) *
                                                               (char)(uVar26 >> 8) - (0xff < uVar27)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22))))))));
    auVar38 = _DAT_00514cd0;
    dst = dst + stride;
  } while (uVar15 < 0xd0c0d0d);
  auVar18._0_2_ = sVar16 * 0xbc;
  auVar18._2_2_ = sVar19 * 0xca;
  auVar18._4_2_ = sVar16 * 0xd5;
  auVar18._6_2_ = sVar19 * 0xdf;
  auVar18._8_2_ = sVar16 * 0xe6;
  auVar18._10_2_ = sVar19 * 0xec;
  auVar18._12_2_ = sVar16 * 0xef;
  auVar18._14_2_ = sVar19 * 0xf0;
  uVar15 = 0xfefdfefe;
  do {
    uVar15 = uVar15 + 0x2020202;
    auVar23._4_4_ = uVar15;
    auVar23._0_4_ = uVar15;
    auVar23._8_4_ = uVar15;
    auVar23._12_4_ = uVar15;
    auVar17 = pshufb(auVar38,auVar23);
    auVar23 = pshufb(auVar18,auVar23);
    uVar21 = auVar17._0_2_ * (ushort)(byte)uVar1 + auVar23._0_2_ + 0x80;
    uVar24 = auVar17._2_2_ * auVar12._0_2_ + auVar23._2_2_ + 0x80;
    uVar26 = auVar17._4_2_ * auVar11._0_2_ + auVar23._4_2_ + 0x80;
    uVar28 = auVar17._6_2_ * sVar20 + auVar23._6_2_ + 0x80;
    uVar30 = auVar17._8_2_ * auVar7._8_2_ + auVar23._8_2_ + 0x80;
    uVar32 = auVar17._10_2_ * auVar5._10_2_ + auVar23._10_2_ + 0x80;
    uVar34 = auVar17._12_2_ * auVar3._12_2_ + auVar23._12_2_ + 0x80;
    uVar36 = auVar17._14_2_ * uVar8 + auVar23._14_2_ + 0x80;
    uVar22 = uVar21 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    uVar37 = uVar36 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar29 != 0) * (uVar29 < 0x100) *
                                                      (char)(uVar28 >> 8) - (0xff < uVar29),
                                                      CONCAT12((uVar27 != 0) * (uVar27 < 0x100) *
                                                               (char)(uVar26 >> 8) - (0xff < uVar27)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22))))))));
    dst = dst + stride;
  } while (uVar15 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_8x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);

  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
}